

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O1

void Add(string *progname,const_iterator beginargs,const_iterator endargs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  void *pvVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  char cVar5;
  ostream *poVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *spec;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  ParseError e;
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  pathspec;
  Flag refresh;
  Flag verbose;
  HelpFlag help;
  Flag dryrun;
  ArgumentParser parser;
  undefined1 local_a80 [8];
  _Alloc_hider local_a78;
  char local_a70 [8];
  char local_a68 [16];
  string local_a58;
  string local_a38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [32];
  _Alloc_hider local_9d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_9d0;
  pointer local_968;
  pointer local_960;
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  _Alloc_hider local_900;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_8f8 [3];
  undefined1 local_820 [16];
  __node_base local_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  undefined2 local_7f8;
  _Alloc_hider local_7f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_7e8 [3];
  FlagBase local_710;
  undefined1 local_600 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_5c8 [3];
  undefined1 local_4f0 [1216];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Add",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  psVar2 = &local_710.super_NamedBase.super_Base.help;
  local_710.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"");
  local_600._8_8_ = 0;
  local_600[0x10] = '\0';
  local_600._0_8_ = local_600 + 0x10;
  args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)local_4f0,(string *)&local_710,(string *)local_600);
  if ((undefined1 *)local_600._0_8_ != local_600 + 0x10) {
    operator_delete((void *)local_600._0_8_);
  }
  if ((string *)local_710.super_NamedBase.super_Base._vptr_Base != psVar2) {
    operator_delete(local_710.super_NamedBase.super_Base._vptr_Base);
  }
  pcVar3 = (progname->_M_dataplus)._M_p;
  local_710.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_710,pcVar3,pcVar3 + progname->_M_string_length);
  std::__cxx11::string::append((char *)&local_710);
  std::__cxx11::string::_M_assign((string *)(local_4f0 + 0x2b8));
  if ((string *)local_710.super_NamedBase.super_Base._vptr_Base != psVar2) {
    operator_delete(local_710.super_NamedBase.super_Base._vptr_Base);
  }
  local_a10._M_current = beginargs._M_current;
  local_930._0_8_ = local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"help","");
  local_a08._0_8_ = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"Display this help menu","");
  local_820._8_8_ = &local_808;
  local_820[0] = true;
  local_820[1] = 'h';
  local_810._M_nxt = (_Hash_node_base *)0x0;
  local_808._M_local_buf[0] = '\0';
  local_7f8 = 0;
  local_7f0._M_p = (pointer)&local_7e8[0]._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_820;
  args::Matcher::Matcher((Matcher *)local_600,in);
  args::Flag::Flag((Flag *)&local_710,(Group *)local_4f0,(string *)local_930,(string *)local_a08,
                   (Matcher *)local_600,None);
  local_710.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_00122520;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_5c8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_600);
  lVar7 = 0;
  do {
    pvVar4 = *(void **)((long)local_7e8 + lVar7 + -8);
    if ((void *)((long)&local_7e8[0]._M_bucket_count + lVar7) != pvVar4) {
      operator_delete(pvVar4);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x50);
  if ((undefined1 *)local_a08._0_8_ != local_9f8) {
    operator_delete((void *)local_a08._0_8_);
  }
  if ((undefined1 *)local_930._0_8_ != local_920) {
    operator_delete((void *)local_930._0_8_);
  }
  local_a08._0_8_ = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"dryrun","");
  local_a80 = (undefined1  [8])local_a70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"dry run","");
  local_930._8_8_ = local_920 + 8;
  local_930._0_2_ = 0x6e01;
  local_920._0_8_ = 0;
  local_920[8] = '\0';
  local_920._24_2_ = 0;
  local_900._M_p = (pointer)&local_8f8[0]._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"dry-run","");
  in_00._M_len = 2;
  in_00._M_array = (iterator)local_930;
  args::Matcher::Matcher((Matcher *)local_820,in_00);
  args::Flag::Flag((Flag *)local_600,(Group *)local_4f0,(string *)local_a08,(string *)local_a80,
                   (Matcher *)local_820,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_7e8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_820);
  lVar7 = 0;
  do {
    pvVar4 = *(void **)((long)local_8f8 + lVar7 + -8);
    if ((void *)((long)&local_8f8[0]._M_bucket_count + lVar7) != pvVar4) {
      operator_delete(pvVar4);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x50);
  if (local_a80 != (undefined1  [8])local_a70) {
    operator_delete((void *)local_a80);
  }
  if ((undefined1 *)local_a08._0_8_ != local_9f8) {
    operator_delete((void *)local_a08._0_8_);
  }
  local_a80 = (undefined1  [8])local_a70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"verbose","");
  paVar1 = &local_a58.field_2;
  local_a58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"be verbose","");
  local_a08._8_8_ = local_9f8 + 8;
  local_a08._0_2_ = 0x7601;
  local_9f8._0_8_ = 0;
  local_9f8[8] = '\0';
  local_9f8._24_2_ = 0;
  local_9d8._M_p = (pointer)&local_9d0._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"verbose","");
  in_01._M_len = 2;
  in_01._M_array = (iterator)local_a08;
  args::Matcher::Matcher((Matcher *)local_930,in_01);
  args::Flag::Flag((Flag *)local_820,(Group *)local_4f0,(string *)local_a80,&local_a58,
                   (Matcher *)local_930,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_8f8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_930);
  lVar7 = 0;
  do {
    pvVar4 = *(void **)((long)&local_9d8._M_p + lVar7);
    if ((void *)((long)&local_9d0._M_bucket_count + lVar7) != pvVar4) {
      operator_delete(pvVar4);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != paVar1) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  if (local_a80 != (undefined1  [8])local_a70) {
    operator_delete((void *)local_a80);
  }
  local_a58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"refresh","");
  local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a38,"Don\'t add, only refresh the index","");
  local_a80 = (undefined1  [8])((ulong)local_a80 & 0xffffffffffff0000);
  local_a78._M_p = local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"refresh","");
  in_02._M_len = 1;
  in_02._M_array = (iterator)local_a80;
  args::Matcher::Matcher((Matcher *)local_a08,in_02);
  args::Flag::Flag((Flag *)local_930,(Group *)local_4f0,&local_a58,&local_a38,(Matcher *)local_a08,
                   None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_9d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a08);
  if (local_a78._M_p != local_a68) {
    operator_delete(local_a78._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != paVar1) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  local_a80 = (undefined1  [8])local_a70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"pathspec","");
  begin._M_current = local_a10._M_current;
  local_a58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"pathspecs","");
  local_a38._M_dataplus._M_p = (pointer)0x0;
  local_a38._M_string_length = 0;
  local_a38.field_2._M_allocated_capacity = 0;
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::PositionalList((PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
                    *)local_a08,(Group *)local_4f0,(string *)local_a80,&local_a58,
                   (Container *)&local_a38,None);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != paVar1) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  if (local_a80 != (undefined1  [8])local_a70) {
    operator_delete((void *)local_a80);
  }
  (**(_func_int **)(local_4f0._0_8_ + 0x70))((ArgumentParser *)local_4f0);
  args::ArgumentParser::
  Parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((ArgumentParser *)local_4f0,begin,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )endargs._M_current);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dryrun: ",8);
  (**(code **)(local_600._0_8_ + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"verbose: ",9);
  (**(code **)(CONCAT62(local_820._2_6_,local_820._0_2_) + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"refresh: ",9);
  (**(code **)(local_930._0_8_ + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pathspec: ",10);
  (**(code **)(local_a08._0_8_ + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  cVar5 = (**(code **)(local_a08._0_8_ + 0x10))();
  if (cVar5 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"values: ",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    for (; local_968 != local_960; local_968 = local_968 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(local_968->_M_dataplus)._M_p,
                          local_968->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::~PositionalList((PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
                     *)local_a08);
  args::FlagBase::~FlagBase((FlagBase *)local_930);
  args::FlagBase::~FlagBase((FlagBase *)local_820);
  args::FlagBase::~FlagBase((FlagBase *)local_600);
  args::FlagBase::~FlagBase(&local_710);
  local_4f0._0_8_ = &PTR__ArgumentParser_00122118;
  args::HelpParams::~HelpParams((HelpParams *)(local_4f0 + 0x210));
  if ((undefined1 *)local_4f0._472_8_ != local_4f0 + 0x1e8) {
    operator_delete((void *)local_4f0._472_8_);
  }
  if ((undefined1 *)local_4f0._440_8_ != local_4f0 + 0x1c8) {
    operator_delete((void *)local_4f0._440_8_);
  }
  if ((undefined1 *)local_4f0._408_8_ != local_4f0 + 0x1a8) {
    operator_delete((void *)local_4f0._408_8_);
  }
  if ((undefined1 *)local_4f0._376_8_ != local_4f0 + 0x188) {
    operator_delete((void *)local_4f0._376_8_);
  }
  args::Command::~Command((Command *)local_4f0);
  return;
}

Assistant:

void Add(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Add" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " add");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::Flag dryrun(parser, "dryrun", "dry run", {'n', "dry-run"});
    args::Flag verbose(parser, "verbose", "be verbose", {'v', "verbose"});
    args::Flag refresh(parser, "refresh", "Don't add, only refresh the index", {"refresh"});
    args::PositionalList<std::string> pathspec(parser, "pathspec", "pathspecs");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "dryrun: " << bool{dryrun} << std::endl;;
        std::cout << "verbose: " << bool{verbose} << std::endl;
        std::cout << "refresh: " << bool{refresh} << std::endl;
        std::cout << "pathspec: " << bool{pathspec} << std::endl;
        if (pathspec)
        {
            std::cout << "values: " << std::endl;
            for (const auto &spec: args::get(pathspec))
            {
                std::cout << " - " << spec << std::endl;
            }
        }
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}